

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoalType.cpp
# Opt level: O3

void __thiscall GoalType::set_methods(GoalType *this,int n)

{
  if (this->m_method_count_set == true) {
    if (this->m_method_count != n) {
      printf("Type %s had %d methods, set_methods tried to change it to %d\n",
             (this->m_name)._M_dataplus._M_p);
      return;
    }
  }
  else {
    this->m_method_count = n;
    this->m_method_count_set = true;
  }
  return;
}

Assistant:

void GoalType::set_methods(int n) {
  if (m_method_count_set) {
    if (m_method_count != n) {
      printf("Type %s had %d methods, set_methods tried to change it to %d\n", m_name.c_str(),
             m_method_count, n);
    }
  } else {
    m_method_count = n;
    m_method_count_set = true;
  }
}